

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O2

void polynomial_mod(field_t field,polynomial_t dividend,polynomial_t divisor,polynomial_t mod)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  field_logarithm_t *pfVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  pfVar5 = field.log;
  uVar6 = dividend.order;
  if (uVar6 <= mod.order) {
    uVar4 = divisor._8_8_ & 0xffffffff;
    memcpy(mod.coeff,dividend.coeff,(ulong)(uVar6 + 1));
    bVar1 = pfVar5[divisor.coeff[uVar4]];
    iVar8 = uVar6 - divisor.order;
    uVar3 = (ulong)uVar6;
    while ((uVar3 != 0 && (uVar4 <= uVar3))) {
      if ((ulong)mod.coeff[uVar3] != 0) {
        bVar2 = pfVar5[mod.coeff[uVar3]];
        for (uVar6 = 0; uVar6 <= divisor.order; uVar6 = uVar6 + 1) {
          uVar7 = (ulong)divisor.coeff[uVar6];
          if (uVar7 != 0) {
            mod.coeff[iVar8 + uVar6] =
                 mod.coeff[iVar8 + uVar6] ^
                 field.exp[(ulong)pfVar5[uVar7] +
                           (ulong)((uint)(0xff < (ushort)((uint)bVar2 + (uint)(byte)~bVar1)) +
                                   (uint)bVar2 + (uint)(byte)~bVar1 & 0xff)];
          }
        }
      }
      iVar8 = iVar8 + -1;
      uVar3 = uVar3 - 1;
    }
  }
  return;
}

Assistant:

void polynomial_mod(field_t field, polynomial_t dividend, polynomial_t divisor, polynomial_t mod) {
    // find the polynomial remainder of dividend mod divisor
    // do long division and return just the remainder (written to mod)

    if (mod.order < dividend.order) {
        // mod.order must be >= dividend.order (scratch space needed)
        // this is an error -- catch it in debug?
        return;
    }
    // initialize remainder as dividend
    memcpy(mod.coeff, dividend.coeff, sizeof(field_element_t) * (dividend.order + 1));

    // XXX make sure divisor[divisor_order] is nonzero
    field_logarithm_t divisor_leading = field.log[divisor.coeff[divisor.order]];
    // long division steps along one order at a time, starting at the highest order
    for (unsigned int i = dividend.order; i > 0; i--) {
        // look at the leading coefficient of dividend and divisor
        // if leading coefficient of dividend / leading coefficient of divisor is q
        //   then the next row of subtraction will be q * divisor
        // if order of q < 0 then what we have is the remainder and we are done
        if (i < divisor.order) {
            break;
        }
        if (mod.coeff[i] == 0) {
            continue;
        }
        unsigned int q_order = i - divisor.order;
        field_logarithm_t q_coeff = field_div_log(field, field.log[mod.coeff[i]], divisor_leading);

        // now that we've chosen q, multiply the divisor by q and subtract from
        //   our remainder. subtracting in GF(2^8) is XOR, just like addition
        for (unsigned int j = 0; j <= divisor.order; j++) {
            if (divisor.coeff[j] == 0) {
                continue;
            }
            // all of the multiplication is shifted up by q_order places
            mod.coeff[j + q_order] = field_add(field, mod.coeff[j + q_order],
                        field_mul_log_element(field, field.log[divisor.coeff[j]], q_coeff));
        }
    }
}